

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::parseStatement(StructuralParser *this)

{
  char *pcVar1;
  bool bVar2;
  Block *pBVar3;
  Statement *pSVar4;
  VariableDeclaration *pVVar5;
  Expression *pEVar6;
  Identifier name;
  pool_ref<soul::AST::VariableDeclaration> *ppVar7;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> *this_00;
  long lVar8;
  long lVar9;
  pool_ptr<soul::AST::Expression> type;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> variablesCreated;
  Context local_68;
  Context context;
  UTF8Reader local_38;
  pool_ptr<soul::AST::NoopStatement> local_30;
  pool_ptr<soul::AST::Function> local_28;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x275da0);
  if (bVar2) {
    local_28.object = (Function *)0x0;
    pBVar3 = parseBracedBlock(this,&local_28);
    return &pBVar3->super_Statement;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b333);
  if (bVar2) {
    pSVar4 = parseIf(this);
    return pSVar4;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297540);
  if (bVar2) {
    pSVar4 = parseWhileLoop(this);
    return pSVar4;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29adf9);
  if (bVar2) {
    pSVar4 = parseForLoop(this);
    return pSVar4;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x299ff5);
  if (bVar2) {
    pSVar4 = parseLoopStatement(this);
    return pSVar4;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297564);
  if (bVar2) {
    pSVar4 = parseReturn(this);
    return pSVar4;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297546);
  if (bVar2) {
    getContext((Context *)&variablesCreated,this);
    pVVar5 = (VariableDeclaration *)
             allocate<soul::AST::BreakStatement,soul::AST::Context>
                       (this,(Context *)&variablesCreated);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297597);
    if (!bVar2) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297525);
      if (bVar2) {
        bVar2 = true;
LAB_00211ccb:
        pSVar4 = parseLocalLetOrVar(this,bVar2);
        return pSVar4;
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x297529);
      if (bVar2) {
        bVar2 = false;
        goto LAB_00211ccb;
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x297424);
      if (bVar2) {
        Errors::externalNotAllowedInFunction<>();
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
        CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
      if (bVar2) {
        pSVar4 = getNoop(this);
        return pSVar4;
      }
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x274459);
      if (bVar2) {
        bVar2 = true;
      }
      else {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x296b6b);
        if (!bVar2) {
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x29b537);
          if (bVar2) {
            pEVar6 = parseFactor(this);
            goto LAB_00211d6c;
          }
          bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                  ::
                  matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                            ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                              *)this,(TokenType)0x275cde,(TokenType)0x275ce9,(TokenType)0x275d83,
                             (TokenType)0x275d8c,(TokenType)0x275d47,(TokenType)0x296b6c,
                             (TokenType)0x275d73,(TokenType)0x275d7b);
          if (bVar2) {
            bVar2 = false;
LAB_00211f32:
            pEVar6 = parseExpressionAsStatement(this,bVar2);
            return &pEVar6->super_Statement;
          }
          pcVar1 = (this->super_SOULTokeniser).location.location.data;
          tryParsingType((StructuralParser *)&type,(ParseTypeContext)this);
          if ((type.object == (Expression *)0x0) ||
             (bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matches(&this->super_SOULTokeniser,(TokenType)0x275bb9), !bVar2)) {
            local_38.data = pcVar1;
            Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::resetPosition(&this->super_SOULTokeniser,&local_38);
            bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matches(&this->super_SOULTokeniser,(TokenType)0x275bb9);
            if (!bVar2) {
              giveErrorOnExternalKeyword(this);
              giveErrorOnAssignmentToProcessorProperty(this);
            }
            bVar2 = true;
            goto LAB_00211f32;
          }
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matches(&this->super_SOULTokeniser,(TokenType)0x29b537);
          if (bVar2) {
            Errors::expectedVariableDecl<>();
            (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&variablesCreated);
            CompileMessage::~CompileMessage((CompileMessage *)&variablesCreated);
          }
          getContext(&context,this);
          variablesCreated.items =
               (pool_ref<soul::AST::VariableDeclaration> *)variablesCreated.space;
          variablesCreated.numActive = 0;
          variablesCreated.numAllocated = 8;
          pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&type);
          name = parseIdentifier(this);
          AST::Context::Context(&local_68,&context);
          local_30.object = (NoopStatement *)&variablesCreated;
          parseVariableDeclaration<soul::StructuralParser::parseStatement()::_lambda(soul::AST::VariableDeclaration&)_1_>
                    (this,pEVar6,name,false,&local_68,(anon_class_8_1_55c32bef *)&local_30);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&local_68);
          ppVar7 = variablesCreated.items;
          if (variablesCreated.numActive == 1) {
            ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>::
                     front(&variablesCreated);
            pVVar5 = ppVar7->object;
          }
          else {
            lVar9 = variablesCreated.numActive << 3;
            for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 8) {
              pBVar3 = getCurrentBlock(this);
              AST::Block::addStatement(pBVar3,*(Statement **)((long)&ppVar7->object + lVar8));
            }
            pVVar5 = (VariableDeclaration *)getNoop(this);
          }
          ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL>::clear
                    (&variablesCreated);
          this_00 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::VariableDeclaration>,_8UL> *)
                    &context;
          goto LAB_00211c8e;
        }
        bVar2 = false;
      }
      pEVar6 = parsePreIncDec(this,bVar2);
LAB_00211d6c:
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
      return &pEVar6->super_Statement;
    }
    getContext((Context *)&variablesCreated,this);
    pVVar5 = (VariableDeclaration *)
             allocate<soul::AST::ContinueStatement,soul::AST::Context>
                       (this,(Context *)&variablesCreated);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
  }
  this_00 = &variablesCreated;
LAB_00211c8e:
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)this_00);
  return &pVVar5->super_Statement;
}

Assistant:

AST::Statement& parseStatement()
    {
        if (matches (Operator::openBrace))     return parseBracedBlock ({});
        if (matchIf (Keyword::if_))            return parseIf();
        if (matchIf (Keyword::while_))         return parseWhileLoop();
        if (matchIf (Keyword::for_))           return parseForLoop();
        if (matchIf (Keyword::loop))           return parseLoopStatement();
        if (matchIf (Keyword::return_))        return parseReturn();
        if (matchIf (Keyword::break_))         return matchEndOfStatement (allocate<AST::BreakStatement> (getContext()));
        if (matchIf (Keyword::continue_))      return matchEndOfStatement (allocate<AST::ContinueStatement> (getContext()));
        if (matchIf (Keyword::let))            return parseLocalLetOrVar (true);
        if (matchIf (Keyword::var))            return parseLocalLetOrVar (false);
        if (matches (Keyword::external))       throwError (Errors::externalNotAllowedInFunction());
        if (matchIf (Operator::semicolon))     return getNoop();
        if (matchIf (Operator::plusplus))      return matchEndOfStatement (parsePreIncDec (true));
        if (matchIf (Operator::minusminus))    return matchEndOfStatement (parsePreIncDec (false));
        if (matches (Operator::openParen))     return matchEndOfStatement (parseFactor());

        if (matchesAny (Token::literalInt32, Token::literalInt64, Token::literalFloat64,
                        Token::literalFloat32, Token::literalString, Operator::minus,
                        Token::literalImag32, Token::literalImag64))
            return parseExpressionAsStatement (false);

        {
            auto oldPos = getCurrentTokeniserPosition();

            if (auto type = tryParsingType (ParseTypeContext::variableType))
            {
                if (matches (Token::identifier))
                {
                    if (matches (Operator::openParen))
                        throwError (Errors::expectedVariableDecl());

                    auto context = getContext();
                    ArrayWithPreallocation<pool_ref<AST::VariableDeclaration>, 8> variablesCreated;

                    parseVariableDeclaration (*type, parseIdentifier(), false, context,
                                              [&] (AST::VariableDeclaration& v) { variablesCreated.push_back (v); });

                    if (variablesCreated.size() == 1)
                        return variablesCreated.front();

                    for (auto& v : variablesCreated)
                        getCurrentBlock().addStatement (v);

                    return getNoop();
                }
            }

            resetPosition (oldPos);
        }

        if (! matches (Token::identifier))
        {
            giveErrorOnExternalKeyword();
            giveErrorOnAssignmentToProcessorProperty();
        }

        return parseExpressionAsStatement (true);
    }